

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void correct_frames_to_key(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  int lookahead_size;
  undefined4 local_18;
  uint local_14;
  
  local_14 = av1_lookahead_depth(*(lookahead_ctx **)(*in_RDI + 0x170),
                                 (COMPRESSOR_STAGE)in_RDI[0x13a98]);
  iVar1 = av1_lookahead_pop_sz
                    (*(lookahead_ctx **)(*in_RDI + 0x170),(COMPRESSOR_STAGE)in_RDI[0x13a98]);
  if ((int)local_14 < iVar1) {
    if (*(int *)((long)in_RDI + 0x6079c) < (int)local_14) {
      local_14 = *(uint *)((long)in_RDI + 0x6079c);
    }
    *(uint *)((long)in_RDI + 0x6079c) = local_14;
  }
  else if (0 < *(int *)(*in_RDI + 0x5bbc)) {
    if (*(int *)((long)in_RDI + 0x6079c) < *(int *)(*in_RDI + 0x5bbc)) {
      local_18 = *(undefined4 *)((long)in_RDI + 0x6079c);
    }
    else {
      local_18 = *(undefined4 *)(*in_RDI + 0x5bbc);
    }
    *(undefined4 *)((long)in_RDI + 0x6079c) = local_18;
  }
  return;
}

Assistant:

static void correct_frames_to_key(AV1_COMP *cpi) {
  int lookahead_size =
      (int)av1_lookahead_depth(cpi->ppi->lookahead, cpi->compressor_stage);
  if (lookahead_size <
      av1_lookahead_pop_sz(cpi->ppi->lookahead, cpi->compressor_stage)) {
    assert(
        IMPLIES(cpi->oxcf.pass != AOM_RC_ONE_PASS && cpi->ppi->frames_left > 0,
                lookahead_size == cpi->ppi->frames_left));
    cpi->rc.frames_to_key = AOMMIN(cpi->rc.frames_to_key, lookahead_size);
  } else if (cpi->ppi->frames_left > 0) {
    // Correct frames to key based on limit
    cpi->rc.frames_to_key =
        AOMMIN(cpi->rc.frames_to_key, cpi->ppi->frames_left);
  }
}